

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kcpu.c
# Opt level: O0

void m68k_init(void)

{
  if (m68k_init::emulation_initialized == 0) {
    m68ki_build_opcode_table();
    m68k_init::emulation_initialized = 1;
  }
  m68k_set_int_ack_callback((_func_int_int *)0x0);
  m68k_set_bkpt_ack_callback((_func_void_uint *)0x0);
  m68k_set_reset_instr_callback((_func_void *)0x0);
  m68k_set_cmpild_instr_callback((_func_void_uint_int *)0x0);
  m68k_set_rte_instr_callback((_func_void *)0x0);
  m68k_set_tas_instr_callback((_func_int *)0x0);
  m68k_set_illg_instr_callback((_func_int_int *)0x0);
  m68k_set_pc_changed_callback((_func_void_uint *)0x0);
  m68k_set_fc_callback((_func_void_uint *)0x0);
  m68k_set_instr_hook_callback((_func_void_uint *)0x0);
  return;
}

Assistant:

void m68k_init(void)
{
	static uint emulation_initialized = 0;

	/* The first call to this function initializes the opcode handler jump table */
	if(!emulation_initialized)
		{
		m68ki_build_opcode_table();
		emulation_initialized = 1;
	}

	m68k_set_int_ack_callback(NULL);
	m68k_set_bkpt_ack_callback(NULL);
	m68k_set_reset_instr_callback(NULL);
	m68k_set_cmpild_instr_callback(NULL);
	m68k_set_rte_instr_callback(NULL);
	m68k_set_tas_instr_callback(NULL);
	m68k_set_illg_instr_callback(NULL);
	m68k_set_pc_changed_callback(NULL);
	m68k_set_fc_callback(NULL);
	m68k_set_instr_hook_callback(NULL);
}